

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_224::GlobalUseModifier::~GlobalUseModifier(GlobalUseModifier *this)

{
  GlobalUseModifier *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalUseModifier,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseModifier,_void>_>_>
  ::~WalkerPass(&this->
                 super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GlobalUseModifier,_wasm::Visitor<wasm::(anonymous_namespace)::GlobalUseModifier,_void>_>_>
               );
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }